

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageOperations.cpp
# Opt level: O3

char * __thiscall
glcts::TextureCubeMapArrayImageOpCompute::getGeometryShaderCode
          (TextureCubeMapArrayImageOpCompute *this)

{
  return 
  "${VERSION}\n\n${GEOMETRY_SHADER_ENABLE}\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n\nprecision highp float;\n\nlayout (rgba32f,  binding = 0) highp uniform readonly imageCubeArray  imageRead;\nlayout (rgba32i,  binding = 1) highp uniform readonly iimageCubeArray iimageRead;\nlayout (rgba32ui, binding = 2) highp uniform readonly uimageCubeArray uimageRead;\nlayout (rgba32f,  binding = 3) highp uniform writeonly imageCubeArray  imageWrite;\nlayout (rgba32i,  binding = 4) highp uniform writeonly iimageCubeArray iimageWrite;\nlayout (rgba32ui, binding = 5) highp uniform writeonly uimageCubeArray uimageWrite;\n\nuniform ivec3 dimensions;\n\nlayout(points) in;\nlayout(points, max_vertices=1) out;\n\nvoid main()\n{\n\n    for(int w = 0; w < dimensions[0]; ++w)\n    {\n        for(int h = 0; h < dimensions[1]; ++h)\n        {\n            for(int d = 0; d < dimensions[2]; ++d)\n            {\n                ivec3  position  = ivec3(w,h,d);\n                imageStore(imageWrite,  position, imageLoad(imageRead,  position));\n                imageStore(iimageWrite, position, imageLoad(iimageRead, position));\n                imageStore(uimageWrite, position, imageLoad(uimageRead, position));\n            }\n        }\n    }\n\n}\n"
  ;
}

Assistant:

const char* TextureCubeMapArrayImageOpCompute::getGeometryShaderCode(void)
{
	static const char* geometryShaderCode =
		"${VERSION}\n"
		"\n"
		"${GEOMETRY_SHADER_ENABLE}\n"
		"${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n"
		"\n"
		"precision highp float;\n"
		"\n"
		"layout (rgba32f,  binding = 0) highp uniform readonly imageCubeArray  imageRead;\n"
		"layout (rgba32i,  binding = 1) highp uniform readonly iimageCubeArray iimageRead;\n"
		"layout (rgba32ui, binding = 2) highp uniform readonly uimageCubeArray uimageRead;\n"
		"layout (rgba32f,  binding = 3) highp uniform writeonly imageCubeArray  imageWrite;\n"
		"layout (rgba32i,  binding = 4) highp uniform writeonly iimageCubeArray iimageWrite;\n"
		"layout (rgba32ui, binding = 5) highp uniform writeonly uimageCubeArray uimageWrite;\n"
		"\n"
		"uniform ivec3 dimensions;\n"
		"\n"
		"layout(points) in;\n"
		"layout(points, max_vertices=1) out;\n"
		"\n"
		"void main()\n"
		"{\n"
		"\n"
		"    for(int w = 0; w < dimensions[0]; ++w)\n" /* width */
		"    {\n"
		"        for(int h = 0; h < dimensions[1]; ++h)\n" /* height */
		"        {\n"
		"            for(int d = 0; d < dimensions[2]; ++d)\n" /* depth */
		"            {\n"
		"                ivec3  position  = ivec3(w,h,d);\n"
		"                imageStore(imageWrite,  position, imageLoad(imageRead,  position));\n"
		"                imageStore(iimageWrite, position, imageLoad(iimageRead, position));\n"
		"                imageStore(uimageWrite, position, imageLoad(uimageRead, position));\n"
		"            }\n"
		"        }\n"
		"    }\n"
		"\n"
		"}\n";

	return geometryShaderCode;
}